

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * __thiscall
pugi::impl::anon_unknown_0::xpath_string::data(xpath_string *this,xpath_allocator *alloc)

{
  char_t *__src;
  size_t __n;
  char_t *s;
  
  s = this->_buffer;
  if (this->_uses_heap == false) {
    __n = strlength(s);
    __src = this->_buffer;
    s = (char_t *)xpath_allocator::allocate(alloc,__n + 1);
    if (s == (char_t *)0x0) {
      s = (char_t *)0x0;
    }
    else {
      memcpy(s,__src,__n);
      s[__n] = '\0';
      this->_buffer = s;
      this->_uses_heap = true;
      this->_length_heap = __n;
    }
  }
  return s;
}

Assistant:

char_t* data(xpath_allocator* alloc)
		{
			// make private heap copy
			if (!_uses_heap)
			{
				size_t length_ = strlength(_buffer);
				const char_t* data_ = duplicate_string(_buffer, length_, alloc);

				if (!data_) return NULL;

				_buffer = data_;
				_uses_heap = true;
				_length_heap = length_;
			}

			return const_cast<char_t*>(_buffer);
		}